

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QArrayDataPointer<char16_t> * __thiscall
QArrayDataPointer<char16_t>::sliced
          (QArrayDataPointer<char16_t> *__return_storage_ptr__,QArrayDataPointer<char16_t> *this,
          qsizetype pos,qsizetype n)

{
  Data *pDVar1;
  char16_t *pcVar2;
  QTypedArrayData<char16_t> *__old_val;
  
  pDVar1 = this->d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    sliced(__return_storage_ptr__,this,pos,n);
  }
  else {
    pcVar2 = this->ptr;
    this->d = (Data *)0x0;
    __return_storage_ptr__->d = pDVar1;
    this->ptr = (char16_t *)0x0;
    __return_storage_ptr__->ptr = pcVar2 + pos;
    this->size = 0;
    __return_storage_ptr__->size = n;
  }
  return __return_storage_ptr__;
}

Assistant:

QArrayDataPointer sliced(qsizetype pos, qsizetype n) &&
    {
        if (needsDetach())
            return sliced(pos, n);
        T *newBeginning = begin() + pos;
        std::destroy(begin(), newBeginning);
        std::destroy(newBeginning + n, end());
        setBegin(newBeginning);
        size = n;
        return std::move(*this);
    }